

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_ffh_string_byte(lua_State *L)

{
  MSize MVar1;
  int32_t def;
  int32_t iVar2;
  GCstr *pGVar3;
  ulong uVar4;
  int iVar5;
  MSize MVar6;
  uint need;
  int iVar7;
  
  iVar7 = 1;
  pGVar3 = lj_lib_checkstr(L,1);
  MVar1 = pGVar3->len;
  def = lj_lib_optint(L,2,1);
  iVar2 = lj_lib_optint(L,3,def);
  MVar6 = (iVar2 >> 0x1f & MVar1 + 1) + iVar2;
  iVar5 = (def >> 0x1f & MVar1 + 1) + def;
  if (iVar5 < 2) {
    iVar5 = iVar7;
  }
  if ((int)MVar1 <= (int)MVar6) {
    MVar6 = MVar1;
  }
  if (iVar5 <= (int)MVar6) {
    need = MVar6 - (iVar5 - 1U);
    if (8000 < need) {
      lj_err_caller(L,LJ_ERR_STRSLC);
    }
    if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) <= (long)(ulong)(need * 8)) {
      lj_state_growstack(L,need);
    }
    for (uVar4 = 0; need != uVar4; uVar4 = uVar4 + 1) {
      L->base[uVar4 - 1].n =
           (double)*(byte *)((long)&pGVar3[1].nextgc.gcptr32 + uVar4 + (iVar5 - 1U));
    }
    iVar7 = need + 1;
  }
  return iVar7;
}

Assistant:

LJLIB_ASM(string_byte)		LJLIB_REC(string_range 0)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t len = (int32_t)s->len;
  int32_t start = lj_lib_optint(L, 2, 1);
  int32_t stop = lj_lib_optint(L, 3, start);
  int32_t n, i;
  const unsigned char *p;
  if (stop < 0) stop += len+1;
  if (start < 0) start += len+1;
  if (start <= 0) start = 1;
  if (stop > len) stop = len;
  if (start > stop) return FFH_RES(0);  /* Empty interval: return no results. */
  start--;
  n = stop - start;
  if ((uint32_t)n > LUAI_MAXCSTACK)
    lj_err_caller(L, LJ_ERR_STRSLC);
  lj_state_checkstack(L, (MSize)n);
  p = (const unsigned char *)strdata(s) + start;
  for (i = 0; i < n; i++)
    setintV(L->base + i-1, p[i]);
  return FFH_RES(n);
}